

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Forel.cpp
# Opt level: O0

Point * __thiscall
Forel::mass_centre(Point *__return_storage_ptr__,Forel *this,
                  vector<Point,_std::allocator<Point>_> *points,
                  vector<int,_std::allocator<int>_> *inside_circle)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  size_type sVar4;
  int local_34;
  double dStack_30;
  int i;
  double y;
  double x;
  vector<int,_std::allocator<int>_> *inside_circle_local;
  vector<Point,_std::allocator<Point>_> *points_local;
  Forel *this_local;
  
  local_34 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(inside_circle);
    if ((int)sVar1 <= local_34) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](inside_circle,(long)local_34);
    pvVar3 = std::vector<Point,_std::allocator<Point>_>::operator[](points,(long)*pvVar2);
    y = pvVar3->x + y;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](inside_circle,(long)local_34);
    pvVar3 = std::vector<Point,_std::allocator<Point>_>::operator[](points,(long)*pvVar2);
    dStack_30 = pvVar3->y + dStack_30;
    local_34 = local_34 + 1;
  }
  sVar1 = std::vector<int,_std::allocator<int>_>::size(inside_circle);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(inside_circle);
  Point::Point(__return_storage_ptr__,y / (double)(int)sVar1,dStack_30 / (double)(int)sVar4);
  return __return_storage_ptr__;
}

Assistant:

Point Forel::mass_centre(vector<Point> points, vector<int> inside_circle) {
    double x, y;
    for (int i = 0; i < (int) inside_circle.size(); i++) {
        x += points[inside_circle[i]].x;
        y += points[inside_circle[i]].y;

    }
    x = x / (int) inside_circle.size();
    y = y / (int) inside_circle.size();
    return Point(x, y);
}